

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::DoubleToDecimalCast<double,duckdb::hugeint_t>
               (double input,hugeint_t *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  double dVar1;
  bool bVar2;
  InvalidInputException *this;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  CastParameters *this_00;
  uchar in_R8B;
  double dVar3;
  double value;
  double __x;
  string error;
  hugeint_t result_1;
  string local_78;
  Exception local_58;
  undefined1 local_48 [16];
  hugeint_t local_38;
  
  __x = *(double *)
         (NumericHelper::DOUBLE_POWERS_OF_TEN +
         (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8) * input;
  this_00 = parameters;
  dVar3 = round(__x);
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  if (-dVar1 < dVar3 && dVar3 < dVar1) {
    value = nearbyint(__x);
    bVar2 = Hugeint::TryConvert<double>(value,&local_38);
    if (!bVar2) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,duckdb::hugeint_t>(&local_78,(duckdb *)this_00,__x);
      InvalidInputException::InvalidInputException(this,&local_78);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    result->lower = local_38.lower;
    result->upper = local_38.upper;
  }
  else {
    local_58._0_8_ = local_48;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Could not cast value %f to DECIMAL(%d,%d)","");
    Exception::ConstructMessage<double,unsigned_char,unsigned_char>
              (&local_78,&local_58,(string *)(ulong)width,input,scale,in_R8B);
    if ((undefined1 *)local_58._0_8_ != local_48) {
      operator_delete((void *)local_58._0_8_);
    }
    HandleCastError::AssignError(&local_78,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return -dVar1 < dVar3 && dVar3 < dVar1;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(value));
	return true;
}